

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.h
# Opt level: O0

void __thiscall Parameter::print_parameters(Parameter *this)

{
  ostream *poVar1;
  void *pvVar2;
  int *in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"rank: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*in_RDI);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"lambda: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 2));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"epsilon: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 4));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"max_iter: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,in_RDI[6]);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"max_inner_iter: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,in_RDI[7]);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"nodes: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,in_RDI[8]);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"thread: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,in_RDI[9]);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"data_folder: ");
  poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 10));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"verbose: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,(bool)(*(byte *)((long)in_RDI + 0x69) & 1));
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"------------------------------------");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_parameters(){
        cout << "rank: " << Parameter::k << endl;
        cout << "lambda: " << Parameter::lambda << endl;
        cout << "epsilon: " << Parameter::eps << endl;
        cout << "max_iter: " << Parameter::max_iter << endl;
        cout << "max_inner_iter: " << Parameter::max_inner_iter << endl;
        cout << "nodes: " << Parameter::num_of_machine << endl;
        cout << "thread: " << Parameter::num_of_thread << endl;
        cout << "data_folder: " << Parameter::meta_path << endl;
        cout << "verbose: " << Parameter::verbose << endl;
        cout << "------------------------------------" << endl;
    }